

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::egl::GetConfigsBoundsCase::iterate(GetConfigsBoundsCase *this)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  int numConfigAll_00;
  deUint32 dVar2;
  int iVar3;
  EGLint numConfigAll;
  Random rnd;
  int local_1c4;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  (this->super_CallLogWrapper).m_enableLog = true;
  eglu::CallLogWrapper::eglGetConfigs
            (&this->super_CallLogWrapper,this->m_display,(EGLConfig *)0x0,0,&local_1c4);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,local_1c4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," configs available",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  if (local_1c4 < 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "No configs");
  }
  else {
    deRandom_init(&local_1c0,0x7b);
    iVar3 = 5;
    do {
      numConfigAll_00 = local_1c4;
      dVar2 = deRandom_getUint32(&local_1c0);
      checkGetConfigsBounds
                (this,(Random *)&local_1c0,numConfigAll_00,dVar2 % (numConfigAll_00 + 1U));
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    checkGetConfigsBounds(this,(Random *)&local_1c0,local_1c4,-1);
  }
  (this->super_CallLogWrapper).m_enableLog = false;
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		tcu::TestLog&	log		= m_testCtx.getLog();
		EGLint			numConfigAll;

		enableLogging(true);

		eglGetConfigs(m_display, 0, 0, &numConfigAll);

		log << TestLog::Message << numConfigAll << " configs available" << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;

		if (numConfigAll > 0)
		{
			de::Random		rnd					(123);

			for (int i = 0; i < 5; i++)
			{
				checkGetConfigsBounds(rnd, numConfigAll, rnd.getInt(0, numConfigAll));
				log << TestLog::Message << TestLog::EndMessage;
			}

			checkGetConfigsBounds(rnd, numConfigAll, -1);
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "No configs");
		}

		enableLogging(false);

		return STOP;
	}